

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransArray.cc
# Opt level: O2

void __thiscall TransArray::~TransArray(TransArray *this)

{
  pointer piVar1;
  pointer plVar2;
  
  piVar1 = (this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar1) {
    (this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  plVar2 = (this->offset).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->offset).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
      ._M_finish != plVar2) {
    (this->offset).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar2;
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->offset).super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)this);
  return;
}

Assistant:

TransArray::~TransArray() {
    theArray.clear();
    offset.clear();
}